

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_KillTarget
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *inflictor_00;
  AActor *source_00;
  PClassActor *filter_00;
  int flags_00;
  VMValue *pVVar1;
  AActor *killtarget;
  bool bVar2;
  bool local_73;
  FName local_70;
  FName local_6c;
  AActor *local_68;
  AActor *inflictor;
  AActor *source;
  int local_50;
  int inflict;
  int src;
  FName species;
  MetaClass *filter;
  int flags;
  FName damagetype;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1796,
                  "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    _flags = (AActor *)(param->field_0).field_1.a;
    local_73 = true;
    if (_flags != (AActor *)0x0) {
      local_73 = DObject::IsKindOf((DObject *)_flags,AActor::RegistrationInfo.MyClass);
    }
    if (local_73 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1796,
                    "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    FName::FName((FName *)((long)&filter + 4));
    if (numparam < 2) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1797,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      FName::operator=((FName *)((long)&filter + 4),(pVVar1->field_0).i);
    }
    else {
      if (param[1].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1797,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      FName::operator=((FName *)((long)&filter + 4),param[1].field_0.i);
    }
    if (numparam < 3) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1798,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      filter._0_4_ = (pVVar1->field_0).i;
    }
    else {
      if (param[2].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1798,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      filter._0_4_ = param[2].field_0.i;
    }
    if (numparam < 4) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      bVar2 = false;
      if ((pVVar1->field_0).field_3.Type == '\x03') {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        bVar2 = true;
        if ((pVVar1->field_0).field_1.atag != 1) {
          pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
          bVar2 = (pVVar1->field_0).field_1.a == (void *)0x0;
        }
      }
      if (!bVar2) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1799,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      _src = (PClassActor *)(pVVar1->field_0).field_1.a;
    }
    else {
      bVar2 = false;
      if ((param[3].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, param[3].field_0.field_1.atag != 1)) {
        bVar2 = param[3].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1799,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      _src = (PClassActor *)param[3].field_0.field_1.a;
    }
    FName::FName((FName *)&inflict);
    if (numparam < 5) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x179a,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      FName::operator=((FName *)&inflict,(pVVar1->field_0).i);
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x179a,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      FName::operator=((FName *)&inflict,param[4].field_0.i);
    }
    if (numparam < 6) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x179b,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      local_50 = (pVVar1->field_0).i;
    }
    else {
      if (param[5].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x179b,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      local_50 = param[5].field_0.i;
    }
    if (numparam < 7) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x179c,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      source._4_4_ = (pVVar1->field_0).i;
    }
    else {
      if (param[6].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x179c,
                      "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      source._4_4_ = param[6].field_0.i;
    }
    inflictor = COPY_AAPTR(_flags,local_50);
    local_68 = COPY_AAPTR(_flags,source._4_4_);
    bVar2 = TObjPtr<AActor>::operator!=(&_flags->target,(AActor *)0x0);
    if (bVar2) {
      killtarget = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_flags->target);
      source_00 = inflictor;
      inflictor_00 = local_68;
      FName::FName(&local_6c,(FName *)((long)&filter + 4));
      flags_00 = (int)filter;
      filter_00 = _src;
      FName::FName(&local_70,(FName *)&inflict);
      DoKill(killtarget,inflictor_00,source_00,&local_6c,flags_00,filter_00,&local_70);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1796,
                "int AF_AActor_A_KillTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KillTarget)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->target != NULL)
		DoKill(self->target, inflictor, source, damagetype, flags, filter, species);
	return 0;
}